

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOBLoader.cpp
# Opt level: O0

void __thiscall Assimp::LWOImporter::LoadLWOBPolygons(LWOImporter *this,uint length)

{
  uint16_t *_szOut;
  iterator local_38;
  iterator it;
  uint iNumVertices;
  uint iNumFaces;
  uint16_t *cursor;
  uint16_t *end;
  LWOImporter *pLStack_10;
  uint length_local;
  LWOImporter *this_local;
  
  cursor = (uint16_t *)(this->mFileBuffer + length);
  _iNumVertices = (uint16_t *)this->mFileBuffer;
  end._4_4_ = length;
  pLStack_10 = this;
  while (_szOut = _iNumVertices, _iNumVertices < cursor) {
    _iNumVertices = _iNumVertices + 1;
    ByteSwap::Swap2(_szOut);
  }
  _iNumVertices = (uint16_t *)this->mFileBuffer;
  it._M_current._4_4_ = 0;
  it._M_current._0_4_ = 0;
  CountVertsAndFacesLWOB
            (this,(uint *)&it,(uint *)((long)&it._M_current + 4),(uint16_t **)&iNumVertices,cursor,
             0xffffffff);
  if (it._M_current._4_4_ != 0) {
    _iNumVertices = (uint16_t *)this->mFileBuffer;
    std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>::resize
              (&this->mCurLayer->mFaces,(ulong)it._M_current._4_4_);
    local_38 = std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>::begin
                         (&this->mCurLayer->mFaces);
    CopyFaceIndicesLWOB(this,&local_38,(uint16_t **)&iNumVertices,cursor,0xffffffff);
  }
  return;
}

Assistant:

void LWOImporter::LoadLWOBPolygons(unsigned int length)
{
    // first find out how many faces and vertices we'll finally need
    LE_NCONST uint16_t* const end   = (LE_NCONST uint16_t*)(mFileBuffer+length);
    LE_NCONST uint16_t* cursor      = (LE_NCONST uint16_t*)mFileBuffer;

    // perform endianness conversions
#ifndef AI_BUILD_BIG_ENDIAN
    while (cursor < end)ByteSwap::Swap2(cursor++);
    cursor = (LE_NCONST uint16_t*)mFileBuffer;
#endif

    unsigned int iNumFaces = 0,iNumVertices = 0;
    CountVertsAndFacesLWOB(iNumVertices,iNumFaces,cursor,end);

    // allocate the output array and copy face indices
    if (iNumFaces)
    {
        cursor = (LE_NCONST uint16_t*)mFileBuffer;

        mCurLayer->mFaces.resize(iNumFaces);
        FaceList::iterator it = mCurLayer->mFaces.begin();
        CopyFaceIndicesLWOB(it,cursor,end);
    }
}